

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::Swap
          (ExtensionSet *this,MessageLite *extendee,ExtensionSet *other)

{
  uint16_t uVar1;
  Arena *pAVar2;
  AllocatedData AVar3;
  Arena *__tmp;
  ExtensionSet extension_set;
  ExtensionSet local_30;
  
  pAVar2 = this->arena_;
  if (pAVar2 == other->arena_) {
    this->arena_ = other->arena_;
    other->arena_ = pAVar2;
    uVar1 = this->flat_capacity_;
    this->flat_capacity_ = other->flat_capacity_;
    other->flat_capacity_ = uVar1;
    uVar1 = this->flat_size_;
    this->flat_size_ = other->flat_size_;
    other->flat_size_ = uVar1;
    AVar3 = this->map_;
    this->map_ = other->map_;
    other->map_ = AVar3;
  }
  else {
    local_30.arena_ = (Arena *)0x0;
    local_30.flat_capacity_ = 0;
    local_30.flat_size_ = 0;
    local_30.map_.flat = (KeyValue *)0x0;
    MergeFrom(&local_30,extendee,other);
    Clear(other);
    MergeFrom(other,extendee,this);
    Clear(this);
    MergeFrom(this,extendee,&local_30);
    ~ExtensionSet(&local_30);
  }
  return;
}

Assistant:

void ExtensionSet::Swap(const MessageLite* extendee, ExtensionSet* other) {
  if (internal::CanUseInternalSwap(arena_, other->arena_)) {
    InternalSwap(other);
  } else {
    // TODO: We maybe able to optimize a case where we are
    // swapping from heap to arena-allocated extension set, by just Own()'ing
    // the extensions.
    ExtensionSet extension_set;
    extension_set.MergeFrom(extendee, *other);
    other->Clear();
    other->MergeFrom(extendee, *this);
    Clear();
    MergeFrom(extendee, extension_set);
  }
}